

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_struct(CompilerGLSL *this,SPIRType *type)

{
  uint32_t id;
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)1> *pTVar3;
  bool bVar4;
  bool bVar5;
  mapped_type *name_00;
  long lVar6;
  ulong uVar7;
  string name;
  char *local_70 [2];
  char local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  id = (type->type_alias).id;
  if ((id != 0) &&
     (bVar4 = Compiler::has_extended_decoration
                        (&this->super_Compiler,id,SPIRVCrossDecorationBufferBlockRepacked), !bVar4))
  {
    return;
  }
  local_50._M_dataplus._M_p._0_4_ = (type->super_IVariant).self.id;
  name_00 = ::std::__detail::
            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&(this->super_Compiler).ir.meta,(key_type *)&local_50);
  add_variable(this,&this->resource_names,&this->block_names,(string *)name_00);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_50,this,type,0);
  local_70[0] = "Construct ";
  if ((this->backend).explicit_struct_type != false) {
    local_70[0] = "\x05\x05\x04";
  }
  local_70[0] = local_70[0] + 3;
  statement<char_const*,std::__cxx11::string&>(this,local_70,&local_50);
  statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
  this->indent = this->indent + 1;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(type->member_name_cache)._M_h);
  sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  if (sVar2 == 0) {
    bVar4 = false;
  }
  else {
    pTVar3 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    ;
    lVar6 = sVar2 << 2;
    uVar7 = 0;
    do {
      add_member_name(this,type,(uint32_t)uVar7);
      uVar1 = pTVar3[uVar7].id;
      local_70[0] = local_60;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
      (*(this->super_Compiler)._vptr_Compiler[0x15])
                (this,type,(ulong)uVar1,uVar7 & 0xffffffff,(string *)local_70,0);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
    bVar4 = true;
  }
  if (((type->basetype == Struct) &&
      ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
       buffer_size == 0)) && ((this->backend).supports_empty_struct == false)) {
    bVar4 = true;
    statement<char_const(&)[25]>(this,(char (*) [25])"int empty_struct_member;");
  }
  bVar5 = Compiler::has_extended_decoration
                    (&this->super_Compiler,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationPaddingTarget);
  if (bVar5) {
    (*(this->super_Compiler)._vptr_Compiler[0x16])(this,type);
  }
  end_scope_decl(this);
  if (bVar4) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_struct(SPIRType &type)
{
	// Struct types can be stamped out multiple times
	// with just different offsets, matrix layouts, etc ...
	// Type-punning with these types is legal, which complicates things
	// when we are storing struct and array types in an SSBO for example.
	// If the type master is packed however, we can no longer assume that the struct declaration will be redundant.
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
		return;

	add_resource_name(type.self);
	auto name = type_to_glsl(type);

	statement(!backend.explicit_struct_type ? "struct " : "", name);
	begin_scope();

	type.member_name_cache.clear();

	uint32_t i = 0;
	bool emitted = false;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		emit_struct_member(type, member, i);
		i++;
		emitted = true;
	}

	// Don't declare empty structs in GLSL, this is not allowed.
	if (type_is_empty(type) && !backend.supports_empty_struct)
	{
		statement("int empty_struct_member;");
		emitted = true;
	}

	if (has_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget))
		emit_struct_padding_target(type);

	end_scope_decl();

	if (emitted)
		statement("");
}